

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Trainer.cpp
# Opt level: O0

double __thiscall
Trainer::Trainer<Kuhn::Game>::CFR
          (Trainer<Kuhn::Game> *this,Game *game,int playerIndex,double pi,double po)

{
  long lVar1;
  Trainer<Kuhn::Game> *this_00;
  undefined4 action;
  bool bVar2;
  uint actionNum_00;
  int iVar3;
  double *strategy_00;
  double dVar4;
  undefined8 uStack_2a0;
  double local_298;
  double local_290;
  double local_288;
  long local_280;
  double *local_278;
  Node *local_270;
  mapped_type *local_268;
  Node *local_260;
  mapped_type *local_258;
  double local_250;
  double local_248;
  double *local_240;
  mapped_type *local_238;
  int local_22c;
  double local_228;
  Trainer<Kuhn::Game> *local_220;
  double local_218;
  double regretSum;
  double regret;
  undefined1 local_200 [4];
  int a_3;
  Game game_cp_2;
  Trainer<Kuhn::Game> *pTStack_198;
  int a_2;
  double nodeUtil;
  unsigned_long __vla_expr0;
  double *strategy;
  Node *node;
  double chanceProbability_1;
  Game game_cp_1;
  Trainer<Kuhn::Game> *pTStack_f8;
  int a_1;
  double nodeUtil_2;
  undefined1 local_d8 [4];
  int player;
  string infoSet;
  double chanceProbability;
  Game game_cp;
  Trainer<Kuhn::Game> *pTStack_48;
  int a;
  double nodeUtil_1;
  int actionNum;
  double po_local;
  double pi_local;
  int playerIndex_local;
  Game *game_local;
  Trainer<Kuhn::Game> *this_local;
  
  this->mNodeTouchedCnt = this->mNodeTouchedCnt + 1;
  uStack_2a0 = 0x126846;
  local_220 = this;
  bVar2 = Kuhn::Game::done(game);
  if (bVar2) {
    uStack_2a0 = 0x126858;
    this_local = (Trainer<Kuhn::Game> *)Kuhn::Game::payoff(game,playerIndex);
  }
  else {
    uStack_2a0 = 0x12686b;
    actionNum_00 = Kuhn::Game::actionNum(game);
    uStack_2a0 = 0x126877;
    bVar2 = Kuhn::Game::isChanceNode(game);
    if (bVar2) {
      pTStack_48 = (Trainer<Kuhn::Game> *)0x0;
      for (game_cp._92_4_ = 0; (int)game_cp._92_4_ < (int)actionNum_00;
          game_cp._92_4_ = game_cp._92_4_ + 1) {
        uStack_2a0 = 0x1268ab;
        Kuhn::Game::Game((Game *)&chanceProbability,game);
        uStack_2a0 = 0x1268ba;
        Kuhn::Game::step((Game *)&chanceProbability,game_cp._92_4_);
        uStack_2a0 = 0x1268c6;
        local_228 = Kuhn::Game::chanceProbability((Game *)&chanceProbability);
        uStack_2a0 = 0x126906;
        infoSet.field_2._8_8_ = local_228;
        dVar4 = CFR(local_220,(Game *)&chanceProbability,playerIndex,pi,po * local_228);
        pTStack_48 = (Trainer<Kuhn::Game> *)(local_228 * dVar4 + (double)pTStack_48);
      }
      this_local = pTStack_48;
    }
    else {
      uStack_2a0 = 0x126950;
      Kuhn::Game::infoSetStr_abi_cxx11_((string *)local_d8,game);
      uStack_2a0 = 0x126959;
      iVar3 = Kuhn::Game::currentPlayer(game);
      local_22c = iVar3;
      if ((local_220->mUpdate[iVar3] & 1U) == 0) {
        pTStack_f8 = (Trainer<Kuhn::Game> *)0x0;
        for (game_cp_1._92_4_ = 0; (int)game_cp_1._92_4_ < (int)actionNum_00;
            game_cp_1._92_4_ = game_cp_1._92_4_ + 1) {
          uStack_2a0 = 0x1269c0;
          Kuhn::Game::Game((Game *)&chanceProbability_1,game);
          uStack_2a0 = 0x1269d4;
          Kuhn::Game::step((Game *)&chanceProbability_1,game_cp_1._92_4_);
          uStack_2a0 = 0x1269fe;
          local_238 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                      ::at(local_220->mFixedStrategies + iVar3,(key_type *)local_d8);
          uStack_2a0 = 0x126a16;
          local_240 = Node::averageStrategy(*local_238);
          local_250 = local_240[(int)game_cp_1._92_4_];
          uStack_2a0 = 0x126a6e;
          local_248 = CFR(local_220,(Game *)&chanceProbability_1,playerIndex,pi,po * local_250);
          pTStack_f8 = (Trainer<Kuhn::Game> *)(local_250 * local_248 + (double)pTStack_f8);
        }
        this_local = pTStack_f8;
      }
      else {
        uStack_2a0 = 0x126b01;
        local_258 = std::
                    unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                    ::operator[](&local_220->mNodeMap,(key_type *)local_d8);
        strategy = (double *)*local_258;
        if ((mapped_type)strategy == (mapped_type)0x0) {
          uStack_2a0 = 0x126b33;
          local_260 = (Node *)operator_new(0x30);
          uStack_2a0 = 0x126b4b;
          Node::Node(local_260,actionNum_00);
          strategy = (double *)local_260;
          local_270 = local_260;
          uStack_2a0 = 0x126b83;
          local_268 = std::
                      unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Trainer::Node_*>_>_>
                      ::operator[](&local_220->mNodeMap,(key_type *)local_d8);
          *local_268 = local_270;
        }
        uStack_2a0 = 0x126bd3;
        strategy_00 = Node::strategy((Node *)strategy);
        lVar1 = -((ulong)actionNum_00 * 8 + 0xf & 0xfffffffffffffff0);
        local_280 = (long)&local_298 + lVar1;
        pTStack_198 = (Trainer<Kuhn::Game> *)0x0;
        local_278 = strategy_00;
        for (game_cp_2._92_4_ = 0; (int)game_cp_2._92_4_ < (int)actionNum_00;
            game_cp_2._92_4_ = game_cp_2._92_4_ + 1) {
          *(undefined8 *)((long)&uStack_2a0 + lVar1) = 0x126c4e;
          Kuhn::Game::Game((Game *)local_200,game);
          action = game_cp_2._92_4_;
          *(undefined8 *)((long)&uStack_2a0 + lVar1) = 0x126c62;
          Kuhn::Game::step((Game *)local_200,action);
          this_00 = local_220;
          if (iVar3 == playerIndex) {
            dVar4 = strategy_00[(int)game_cp_2._92_4_];
            *(undefined8 *)((long)&uStack_2a0 + lVar1) = 0x126ca6;
            dVar4 = CFR(this_00,(Game *)local_200,playerIndex,pi * dVar4,po);
            *(double *)(local_280 + (long)(int)game_cp_2._92_4_ * 8) = dVar4;
            local_288 = dVar4;
          }
          else {
            dVar4 = strategy_00[(int)game_cp_2._92_4_];
            *(undefined8 *)((long)&uStack_2a0 + lVar1) = 0x126d04;
            dVar4 = CFR(this_00,(Game *)local_200,playerIndex,pi,po * dVar4);
            *(double *)(local_280 + (long)(int)game_cp_2._92_4_ * 8) = dVar4;
            local_290 = dVar4;
          }
          pTStack_198 = (Trainer<Kuhn::Game> *)
                        (strategy_00[(int)game_cp_2._92_4_] *
                         *(double *)(local_280 + (long)(int)game_cp_2._92_4_ * 8) +
                        (double)pTStack_198);
        }
        if (iVar3 == playerIndex) {
          for (regret._4_4_ = 0; iVar3 = regret._4_4_, regret._4_4_ < (int)actionNum_00;
              regret._4_4_ = regret._4_4_ + 1) {
            regretSum = *(double *)(local_280 + (long)regret._4_4_ * 8) - (double)pTStack_198;
            *(undefined8 *)((long)&uStack_2a0 + lVar1) = 0x126ddc;
            local_298 = Node::regretSum((Node *)strategy,iVar3);
            iVar3 = regret._4_4_;
            dVar4 = po * regretSum + local_298;
            local_218 = dVar4;
            *(undefined8 *)((long)&uStack_2a0 + lVar1) = 0x126e25;
            Node::regretSum((Node *)strategy,iVar3,dVar4);
          }
          *(undefined8 *)((long)&uStack_2a0 + lVar1) = 0x126e55;
          Node::strategySum((Node *)strategy,strategy_00,pi);
        }
        this_local = pTStack_198;
      }
      uStack_2a0 = 0x126e86;
      std::__cxx11::string::~string((string *)local_d8);
    }
  }
  return (double)this_local;
}

Assistant:

double Trainer<T>::CFR(const T &game, const int playerIndex, const double pi, const double po) {
    ++mNodeTouchedCnt;

    // return payoff for terminal states
    if (game.done()) {
        return game.payoff(playerIndex);
    }

    // chance node turn
    const int actionNum = game.actionNum();
    if (game.isChanceNode()) {
        double nodeUtil = 0.0;
        for (int a = 0; a < actionNum; ++a) {
            auto game_cp(game);
            game_cp.step(a);
            const double chanceProbability = game_cp.chanceProbability();
            nodeUtil += chanceProbability * CFR(game_cp, playerIndex, pi, po * chanceProbability);
        }
        return nodeUtil;
    }

    // get information set string representation
    std::string infoSet = game.infoSetStr();

    // treat static player as chance node
    const int player = game.currentPlayer();
    if (!mUpdate[player]) {
        double nodeUtil = 0.0;
        for (int a = 0; a < actionNum; ++a) {
            auto game_cp(game);
            game_cp.step(a);
            const auto chanceProbability = double(mFixedStrategies[player].at(infoSet)->averageStrategy()[a]);
            nodeUtil += chanceProbability * CFR(game_cp, playerIndex, pi, po * chanceProbability);
        }
        return nodeUtil;
    }

    // get information set node or create it if nonexistant
    Node *node = mNodeMap[infoSet];
    if (node == nullptr) {
        node = new Node(actionNum);
        mNodeMap[infoSet] = node;
    }

    // get current strategy through regret-matching
    const double *strategy = node->strategy();

    // for each action, recursively call CFR with additional history and probability
    double utils[actionNum];
    double nodeUtil = 0;
    for (int a = 0; a < actionNum; ++a) {
        auto game_cp(game);
        game_cp.step(a);
        if (player == playerIndex) {
            utils[a] = CFR(game_cp, playerIndex, pi * strategy[a], po);
        } else {
            utils[a] = CFR(game_cp, playerIndex, pi, po * strategy[a]);
        }
        nodeUtil += strategy[a] * utils[a];
    }

    if (player == playerIndex) {
        // for each action, compute and accumulate counterfactual regret
        for (int a = 0; a < actionNum; ++a) {
            const double regret = utils[a] - nodeUtil;
            const double regretSum = node->regretSum(a) + po * regret;
            node->regretSum(a, regretSum);
        }
        // update average strategy across all training iterations
        node->strategySum(strategy, pi);
    }

    return nodeUtil;
}